

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpVarint<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  uint32_t *data_00;
  bool bVar3;
  char *pcVar4;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  Nonnull<const_char_*> failure_msg;
  uint uVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  uint uVar7;
  ParseContext *pPVar8;
  ushort *puVar9;
  ulong *puVar10;
  undefined4 *puVar11;
  uint value;
  ulong uVar12;
  uint uVar13;
  FieldEntry *entry;
  uint *puVar14;
  LogMessageFatal local_40;
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)entry & 3) != 0) {
    AlignFail(entry);
  }
  uVar2 = entry->type_card;
  uVar13 = uVar2 & 0x30;
  if (uVar13 == 0x20) {
    pcVar4 = MpRepeatedVarint<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  if (((ulong)data.field_0 & 7) == 0) {
    uVar12 = (ulong)*ptr;
    if ((long)uVar12 < 0) {
      aVar6.data = (long)ptr[1] << 7 | 0x7f;
      if ((long)aVar6 < 0) {
        pPVar8 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
        if ((long)pPVar8 < 0) {
          aVar6.data = aVar6.data & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)aVar6 < 0) {
            pPVar8 = (ParseContext *)((ulong)pPVar8 & ((long)ptr[4] << 0x1c | 0xfffffffU));
            if ((long)pPVar8 < 0) {
              aVar6.data = aVar6.data & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)aVar6 < 0) {
                pPVar8 = (ParseContext *)((ulong)pPVar8 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
                if ((long)pPVar8 < 0) {
                  aVar6.data = aVar6.data & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar6 < 0) {
                    pPVar8 = (ParseContext *)
                             ((ulong)pPVar8 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                    if ((long)pPVar8 < 0) {
                      puVar9 = (ushort *)(ptr + 10);
                      bVar1 = ptr[9];
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') {
                          pcVar4 = Error(msg,(char *)CONCAT71(0xffffffffffffff,bVar1),pPVar8,
                                         (TcFieldData)aVar6,table,hasbits);
                          return pcVar4;
                        }
                        if ((bVar1 & 1) == 0) {
                          pPVar8 = (ParseContext *)((ulong)pPVar8 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      puVar9 = (ushort *)(ptr + 9);
                    }
                  }
                  else {
                    puVar9 = (ushort *)(ptr + 8);
                  }
                }
                else {
                  puVar9 = (ushort *)(ptr + 7);
                }
              }
              else {
                puVar9 = (ushort *)(ptr + 6);
              }
            }
            else {
              puVar9 = (ushort *)(ptr + 5);
            }
          }
          else {
            puVar9 = (ushort *)(ptr + 4);
          }
        }
        else {
          puVar9 = (ushort *)(ptr + 3);
        }
        aVar6.data = aVar6.data & (ulong)pPVar8;
      }
      else {
        puVar9 = (ushort *)(ptr + 2);
      }
      uVar12 = uVar12 & aVar6.data;
    }
    else {
      puVar9 = (ushort *)(ptr + 1);
    }
    uVar5 = uVar2 & 0x600;
    pPVar8 = (ParseContext *)(ulong)uVar5;
    uVar7 = uVar2 & 0x1c0;
    value = (uint)uVar12;
    if ((ulong)uVar7 == 0xc0) {
      if (uVar5 == 0x200) {
        uVar12 = -(ulong)(value & 1) ^ uVar12 >> 1;
      }
    }
    else if (uVar7 == 0x80) {
      if ((uVar2 >> 10 & 1) == 0) {
        if (uVar5 == 0x200) {
          uVar12 = (ulong)(int)(-(value & 1) ^ (uint)(uVar12 >> 1) & 0x7fffffff);
        }
      }
      else {
        data_00 = *(uint32_t **)
                   ((long)&table->has_bits_offset +
                   (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset);
        if (uVar5 == 0x600) {
          if (((int)value < (int)data_00) || ((int)((ulong)data_00 >> 0x20) < (int)value)) {
LAB_002c3db5:
            pcVar4 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
            return pcVar4;
          }
        }
        else {
          bVar3 = ValidateEnum(value,data_00);
          if (!bVar3) goto LAB_002c3db5;
        }
      }
    }
    if (uVar13 == 0x30) {
      ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,pPVar8,msg);
    }
    else if (uVar13 == 0x10) {
      puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)entry->has_idx >> 5) * 4);
      if (((ulong)puVar14 & 3) != 0) goto LAB_002c3e3b;
      *puVar14 = *puVar14 | 1 << ((byte)entry->has_idx & 0x1f);
    }
    if (uVar7 == 0xc0) {
      puVar10 = (ulong *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
      if (((ulong)puVar10 & 7) != 0) {
        AlignFail();
      }
      *puVar10 = uVar12;
    }
    else if (uVar7 == 0x80) {
      puVar11 = (undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
      if (((ulong)puVar11 & 3) != 0) {
LAB_002c3e3b:
        AlignFail();
      }
      *puVar11 = (int)uVar12;
    }
    else {
      if ((uVar2 & 0x1c0) != 0) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                ((ulong)uVar7,0,
                                 "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      *(bool *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset) = uVar12 != 0;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar9) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar14 & 3) != 0) {
          AlignFail(puVar14);
        }
        *puVar14 = *puVar14 | (uint)hasbits;
      }
      return (char *)puVar9;
    }
    uVar13 = (uint)table->fast_idx_mask & (uint)*puVar9;
    if ((uVar13 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar12 = (ulong)(uVar13 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*puVar9 ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
  }
  else {
    UNRECOVERED_JUMPTABLE = table->fallback;
    puVar9 = (ushort *)ptr;
  }
  pcVar4 = (*UNRECOVERED_JUMPTABLE)(msg,(char *)puVar9,ctx,data,table,hasbits);
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpVarint(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if ((data.tag() & 7) != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  // Parse the value:
  const char* ptr2 = ptr;  // save for unknown enum case
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (ptr == nullptr) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }

  // Transform and/or validate the value
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode64(tmp);
    }
  } else if (rep == field_layout::kRep32Bits) {
    if (is_validated_enum) {
      if (!EnumIsValidAux(tmp, xform_val, *table->field_aux(&entry))) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
    }
  }

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = tmp;
  } else if (rep == field_layout::kRep32Bits) {
    RefAt<uint32_t>(base, entry.offset) = static_cast<uint32_t>(tmp);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep8Bits));
    RefAt<bool>(base, entry.offset) = static_cast<bool>(tmp);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}